

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_utils_astc.h
# Opt level: O0

void __thiscall
ktx::OptionsEncodeASTC::process
          (OptionsEncodeASTC *this,Options *param_2,ParseResult *args,Reporter *report)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>_>
  __l;
  bool bVar1;
  int iVar2;
  OptionValue *pOVar3;
  size_t sVar4;
  long in_RDI;
  iterator it;
  string qualityLevelStr;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>_>_>
  *in_stack_fffffffffffffd78;
  uint v;
  ClampedOption<unsigned_int> *in_stack_fffffffffffffd80;
  string *in_stack_fffffffffffffd88;
  hasher *in_stack_fffffffffffffd90;
  size_type in_stack_fffffffffffffd98;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>_>_>
  *in_stack_fffffffffffffda0;
  iterator in_stack_fffffffffffffda8;
  string *option;
  ParseResult *in_stack_fffffffffffffdb0;
  char *in_stack_fffffffffffffdb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  char *in_stack_fffffffffffffdd0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>,_true>
  in_stack_fffffffffffffdd8;
  Reporter *in_stack_fffffffffffffde8;
  Reporter *in_stack_fffffffffffffdf0;
  Reporter *in_stack_fffffffffffffdf8;
  allocator<char> *name;
  ParseResult *in_stack_fffffffffffffe38;
  OptionsEncodeASTC *in_stack_fffffffffffffe40;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>,_true>
  local_1a0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>,_true>
  local_198;
  string local_190 [32];
  string local_170 [33];
  undefined1 local_14f [71];
  undefined1 local_108 [40];
  undefined1 local_e0 [40];
  undefined1 local_b8 [40];
  undefined1 local_90 [40];
  undefined1 *local_68;
  size_type local_60;
  allocator<char> local_41;
  string local_40 [64];
  
  name = &local_41;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
             (allocator<char> *)in_stack_fffffffffffffdb0);
  pOVar3 = cxxopts::ParseResult::operator[]
                     (in_stack_fffffffffffffdb0,&in_stack_fffffffffffffda8->first);
  sVar4 = cxxopts::OptionValue::count(pOVar3);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  if (sVar4 == 0) {
    ClampedOption<unsigned_int>::operator=
              (in_stack_fffffffffffffd80,(uint)((ulong)in_stack_fffffffffffffd78 >> 0x20));
  }
  else {
    if ((process(cxxopts::Options&,cxxopts::ParseResult&,ktx::Reporter&)::
         astc_quality_mapping_abi_cxx11_ == '\0') &&
       (iVar2 = __cxa_guard_acquire(&process(cxxopts::Options&,cxxopts::ParseResult&,ktx::Reporter&)
                                     ::astc_quality_mapping_abi_cxx11_), iVar2 != 0)) {
      local_14f._23_8_ = local_14f + 0x1f;
      local_14f._19_4_ = 0;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
      ::pair<const_char_(&)[8],_ktx_pack_astc_quality_levels_e,_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
                  *)in_stack_fffffffffffffdb0,(char (*) [8])in_stack_fffffffffffffda8,
                 (ktx_pack_astc_quality_levels_e *)in_stack_fffffffffffffda0);
      local_14f._23_8_ = local_108;
      local_14f._15_4_ = 10;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
      ::pair<const_char_(&)[5],_ktx_pack_astc_quality_levels_e,_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
                  *)in_stack_fffffffffffffdb0,(char (*) [5])in_stack_fffffffffffffda8,
                 (ktx_pack_astc_quality_levels_e *)in_stack_fffffffffffffda0);
      local_14f._23_8_ = local_e0;
      local_14f._11_4_ = 0x3c;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
      ::pair<const_char_(&)[7],_ktx_pack_astc_quality_levels_e,_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
                  *)in_stack_fffffffffffffdb0,(char (*) [7])in_stack_fffffffffffffda8,
                 (ktx_pack_astc_quality_levels_e *)in_stack_fffffffffffffda0);
      local_14f._23_8_ = local_b8;
      local_14f._7_4_ = 0x62;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
      ::pair<const_char_(&)[9],_ktx_pack_astc_quality_levels_e,_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
                  *)in_stack_fffffffffffffdb0,(char (*) [9])in_stack_fffffffffffffda8,
                 (ktx_pack_astc_quality_levels_e *)in_stack_fffffffffffffda0);
      local_14f._23_8_ = local_90;
      local_14f._3_4_ = 100;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
      ::pair<const_char_(&)[11],_ktx_pack_astc_quality_levels_e,_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
                  *)in_stack_fffffffffffffdb0,(char (*) [11])in_stack_fffffffffffffda8,
                 (ktx_pack_astc_quality_levels_e *)in_stack_fffffffffffffda0);
      local_68 = local_14f + 0x1f;
      local_60 = 5;
      in_stack_fffffffffffffd78 =
           (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>_>_>
            *)local_14f;
      std::
      allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>_>
      ::allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>_>
                   *)0x219692);
      __l._M_len = (size_type)in_stack_fffffffffffffdb0;
      __l._M_array = in_stack_fffffffffffffda8;
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>_>_>
      ::unordered_map(in_stack_fffffffffffffda0,__l,in_stack_fffffffffffffd98,
                      in_stack_fffffffffffffd90,(key_equal *)in_stack_fffffffffffffd88,
                      (allocator_type *)in_stack_fffffffffffffdc0);
      std::
      allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>_>
      ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>_>
                    *)0x2196df);
      in_stack_fffffffffffffdf0 = (Reporter *)(local_14f + 0x1f);
      in_stack_fffffffffffffde8 = (Reporter *)&local_68;
      do {
        in_stack_fffffffffffffde8 =
             (Reporter *)((long)&in_stack_fffffffffffffde8[-1].commandName.field_2 + 8);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
        ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
                 *)0x219710);
      } while (in_stack_fffffffffffffde8 != in_stack_fffffffffffffdf0);
      in_stack_fffffffffffffdf8 = in_stack_fffffffffffffde8;
      __cxa_atexit(std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>_>_>
                   ::~unordered_map,
                   &process(cxxopts::Options&,cxxopts::ParseResult&,ktx::Reporter&)::
                    astc_quality_mapping_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&process(cxxopts::Options&,cxxopts::ParseResult&,ktx::Reporter&)::
                           astc_quality_mapping_abi_cxx11_);
    }
    captureASTCOption<std::__cxx11::string>
              (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,(char *)name);
    to_lower_copy(in_stack_fffffffffffffd88);
    std::__cxx11::string::~string(local_190);
    in_stack_fffffffffffffdd8._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>_>_>
         ::find(in_stack_fffffffffffffd78,(key_type *)0x2197ab);
    local_198._M_cur = in_stack_fffffffffffffdd8._M_cur;
    local_1a0._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>_>_>
         ::end(in_stack_fffffffffffffd78);
    v = (uint)((ulong)in_stack_fffffffffffffd78 >> 0x20);
    bVar1 = std::__detail::operator==(&local_198,&local_1a0);
    if (bVar1) {
      Reporter::fatal_usage<char_const(&)[27],std::__cxx11::string_const&>
                (in_stack_fffffffffffffdf8,(char (*) [27])in_stack_fffffffffffffdf0,
                 &in_stack_fffffffffffffde8->commandName);
    }
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>,_false,_true>
    ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>,_false,_true>
                  *)0x219983);
    ClampedOption<unsigned_int>::operator=(in_stack_fffffffffffffd80,v);
    std::__cxx11::string::~string(local_170);
  }
  option = (string *)&stack0xfffffffffffffe3f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
             (allocator<char> *)in_stack_fffffffffffffdb0);
  pOVar3 = cxxopts::ParseResult::operator[](in_stack_fffffffffffffdb0,option);
  sVar4 = cxxopts::OptionValue::count(pOVar3);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe40);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe3f);
  if (sVar4 != 0) {
    captureASTCOption((OptionsEncodeASTC *)in_stack_fffffffffffffdd8._M_cur,
                      in_stack_fffffffffffffdd0);
    *(undefined1 *)(in_RDI + 0x19) = 1;
  }
  return;
}

Assistant:

void process(cxxopts::Options&, cxxopts::ParseResult& args, Reporter& report) {
        if (args[kAstcQuality].count()) {
            static std::unordered_map<std::string, ktx_pack_astc_quality_levels_e> astc_quality_mapping{
                    {"fastest", KTX_PACK_ASTC_QUALITY_LEVEL_FASTEST},
                    {"fast", KTX_PACK_ASTC_QUALITY_LEVEL_FAST},
                    {"medium", KTX_PACK_ASTC_QUALITY_LEVEL_MEDIUM},
                    {"thorough", KTX_PACK_ASTC_QUALITY_LEVEL_THOROUGH},
                    {"exhaustive", KTX_PACK_ASTC_QUALITY_LEVEL_EXHAUSTIVE}
            };
            const auto qualityLevelStr = to_lower_copy(captureASTCOption<std::string>(args, kAstcQuality));
            const auto it = astc_quality_mapping.find(qualityLevelStr);
            if (it == astc_quality_mapping.end())
                report.fatal_usage("Invalid astc-quality: \"{}\"", qualityLevelStr);
            qualityLevel = it->second;
        } else {
            qualityLevel = KTX_PACK_ASTC_QUALITY_LEVEL_MEDIUM;
        }

        if (args[kAstcPerceptual].count()) {
            captureASTCOption(kAstcPerceptual);
            perceptual = KTX_TRUE;
        }
    }